

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O2

void duckdb::RollbackUpdate<duckdb::uhugeint_t>(UpdateInfo *base_info,UpdateInfo *rollback_info)

{
  undefined8 *puVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  undefined8 uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  undefined8 *puVar9;
  undefined8 *puVar10;
  
  uVar3 = base_info->max;
  uVar4 = rollback_info->max;
  lVar8 = 0;
  for (uVar6 = 0; uVar6 < rollback_info->N; uVar6 = uVar6 + 1) {
    lVar7 = lVar8 + -1;
    puVar10 = (undefined8 *)((long)&(&base_info->next)[lVar8].entry + (ulong)uVar3 * 4);
    do {
      puVar9 = puVar10;
      lVar8 = lVar7 + 1;
      puVar10 = puVar9 + 2;
      lVar2 = lVar7 * 4;
      lVar7 = lVar8;
    } while (*(uint *)((long)&base_info[1].segment + lVar2 + 4) <
             *(uint *)((long)&rollback_info[1].segment + uVar6 * 4));
    puVar1 = (undefined8 *)((long)&rollback_info[1].segment + uVar6 * 0x10 + (ulong)uVar4 * 4);
    uVar5 = puVar1[1];
    *puVar10 = *puVar1;
    puVar9[3] = uVar5;
  }
  return;
}

Assistant:

data_ptr_t UpdateInfo::GetValues() {
	return reinterpret_cast<data_ptr_t>(data_ptr_cast(this) + sizeof(UpdateInfo) + sizeof(sel_t) * max);
}